

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

uint32_t iter_predtest_fwd(uint64_t d,uint64_t g,uint32_t flags)

{
  uint64_t uVar1;
  undefined4 local_1c;
  uint32_t flags_local;
  uint64_t g_local;
  uint64_t d_local;
  
  local_1c = flags;
  if (g != 0) {
    if ((flags & 4) == 0) {
      local_1c = (uint)((d & g & -g) != 0) << 0x1f | flags | 4;
    }
    uVar1 = pow2floor(g);
    local_1c = deposit32((uint)((d & g) != 0) << 1 | local_1c,0,1,(uint)((d & uVar1) == 0));
  }
  return local_1c;
}

Assistant:

static uint32_t iter_predtest_fwd(uint64_t d, uint64_t g, uint32_t flags)
{
    if (likely(g)) {
        /* Compute N from first D & G.
           Use bit 2 to signal first G bit seen.  */
        if (!(flags & 4)) {
#ifdef _MSC_VER
            flags |= ((d & (g & (0 - g))) != 0) << 31;
#else
            flags |= ((d & (g & -g)) != 0) << 31;
#endif
            flags |= 4;
        }

        /* Accumulate Z from each D & G.  */
        flags |= ((d & g) != 0) << 1;

        /* Compute C from last !(D & G).  Replace previous.  */
        flags = deposit32(flags, 0, 1, (d & pow2floor(g)) == 0);
    }
    return flags;
}